

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O0

void __thiscall
helics::apps::Source::linkPublicationToGenerator(Source *this,string_view key,int genIndex)

{
  string_view message;
  bool bVar1;
  InvalidParameter *this_00;
  deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_> *this_01;
  reference pvVar2;
  int in_ECX;
  char *in_RDI;
  iterator fnd;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined1 *puVar3;
  allocator<char> *in_stack_ffffffffffffff70;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  _Self local_30;
  _Self local_28;
  int local_1c;
  
  local_1c = in_ECX;
  local_28._M_node =
       (_Base_ptr)
       CLI::std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::find(in_stack_ffffffffffffff38,(key_type *)0x2375d7);
  local_30._M_node =
       (_Base_ptr)
       CLI::std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::end(in_stack_ffffffffffffff38);
  bVar1 = CLI::std::operator==(&local_28,&local_30);
  if (!bVar1) {
    this_01 = (deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_> *)
              (in_RDI + 0xa0);
    CLI::std::
    _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                  *)0x237749);
    pvVar2 = CLI::std::
             deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>::
             operator[](this_01,(size_type)in_stack_ffffffffffffff38);
    pvVar2->generatorIndex = local_1c;
    return;
  }
  this_00 = (InvalidParameter *)__cxa_allocate_exception(0x28);
  puVar3 = &stack0xffffffffffffff7f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 (char *)in_stack_ffffffffffffff40);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff40);
  message._M_str = in_RDI;
  message._M_len = (size_t)puVar3;
  InvalidParameter::InvalidParameter(this_00,message);
  __cxa_throw(this_00,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
}

Assistant:

void Source::linkPublicationToGenerator(std::string_view key, int genIndex)
    {
        auto fnd = pubids.find(key);
        if (fnd == pubids.end()) {
            // only get here if something wasn't found
            throw(
                InvalidParameter(std::string(key) + " was not recognized as a valid publication"));
        }
        sources[fnd->second].generatorIndex = genIndex;
    }